

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palobjbase.cpp
# Opt level: O2

void __thiscall CorUnix::CPalObjectBase::~CPalObjectBase(CPalObjectBase *this)

{
  (this->super_IPalObject)._vptr_IPalObject = (_func_int **)&PTR_GetObjectType_0135f6b8;
  if (PAL_InitializeChakraCoreCalled != false) {
    if (this->m_pvImmutableData != (void *)0x0) {
      InternalFree(this->m_pvImmutableData);
    }
    if (this->m_pvLocalData != (void *)0x0) {
      InternalFree(this->m_pvLocalData);
    }
    if ((this->m_oa).sObjectName.m_pwsz != (WCHAR *)0x0) {
      CPalString::FreeBuffer(&(this->m_oa).sObjectName);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      CSimpleDataLock::~CSimpleDataLock(&this->m_sdlLocalData);
      return;
    }
  }
  abort();
}

Assistant:

CPalObjectBase::~CPalObjectBase()
{
    ENTRY("CPalObjectBase::~CPalObjectBase(this = %p)\n", this);

    if (NULL != m_pvImmutableData)
    {
        InternalFree(m_pvImmutableData);
    }

    if (NULL != m_pvLocalData)
    {
        InternalFree(m_pvLocalData);
    }

    if (NULL != m_oa.sObjectName.GetString())
    {
        m_oa.sObjectName.FreeBuffer();
    }

    LOGEXIT("CPalObjectBase::~CPalObjectBase\n");
}